

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O0

void __thiscall EventInfo::EventInfo(EventInfo *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  EventInfo *local_10;
  EventInfo *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->context,"",local_25);
  std::allocator<char>::~allocator(local_25);
  this->time_minutes = 0.0;
  this->time_seconds = 0.0;
  return;
}

Assistant:

EventInfo() :
		label (""),
		context (""),
		time_minutes (0.f),
		time_seconds (0.f)
	{}